

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setCursor(QWidget *this,QCursor *cursor)

{
  QWidgetPrivate *this_00;
  QWExtra *pQVar1;
  __uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_> __p;
  int iVar2;
  QCursor *cursor_00;
  long in_FS_OFFSET;
  __uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_> local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  iVar2 = QCursor::shape();
  if ((iVar2 != 0) ||
     ((pQVar1 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
                _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl, pQVar1 != (QWExtra *)0x0 &&
      ((_Head_base<0UL,_QCursor_*,_false>)
       *(_Tuple_impl<0UL,_QCursor_*,_std::default_delete<QCursor>_> *)
        &(pQVar1->curs)._M_t.super___uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_> !=
       (QCursor *)0x0)))) {
    QWidgetPrivate::createExtra(this_00);
    std::make_unique<QCursor,QCursor_const&>((QCursor *)&local_38);
    __p._M_t.super__Tuple_impl<0UL,_QCursor_*,_std::default_delete<QCursor>_>.
    super__Head_base<0UL,_QCursor_*,_false>._M_head_impl =
         local_38._M_t.super__Tuple_impl<0UL,_QCursor_*,_std::default_delete<QCursor>_>.
         super__Head_base<0UL,_QCursor_*,_false>._M_head_impl;
    local_38._M_t.super__Tuple_impl<0UL,_QCursor_*,_std::default_delete<QCursor>_>.
    super__Head_base<0UL,_QCursor_*,_false>._M_head_impl =
         (tuple<QCursor_*,_std::default_delete<QCursor>_>)
         (_Tuple_impl<0UL,_QCursor_*,_std::default_delete<QCursor>_>)0x0;
    std::__uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_>::reset
              ((__uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_> *)
               &((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                 ._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->curs,
               (pointer)__p._M_t.super__Tuple_impl<0UL,_QCursor_*,_std::default_delete<QCursor>_>.
                        super__Head_base<0UL,_QCursor_*,_false>._M_head_impl);
    std::unique_ptr<QCursor,_std::default_delete<QCursor>_>::~unique_ptr
              ((unique_ptr<QCursor,_std::default_delete<QCursor>_> *)&local_38);
  }
  cursor_00 = (QCursor *)0x26;
  setAttribute(this,WA_SetCursor,true);
  QWidgetPrivate::setCursor_sys(this_00,cursor_00);
  local_38._M_t.super__Tuple_impl<0UL,_QCursor_*,_std::default_delete<QCursor>_>.
  super__Head_base<0UL,_QCursor_*,_false>._M_head_impl =
       (tuple<QCursor_*,_std::default_delete<QCursor>_>)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_38,CursorChange);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_38);
  QEvent::~QEvent((QEvent *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setCursor(const QCursor &cursor)
{
    Q_D(QWidget);
    if (cursor.shape() != Qt::ArrowCursor
        || (d->extra && d->extra->curs))
    {
        d->createExtra();
        d->extra->curs = std::make_unique<QCursor>(cursor);
    }
    setAttribute(Qt::WA_SetCursor);
    d->setCursor_sys(cursor);

    QEvent event(QEvent::CursorChange);
    QCoreApplication::sendEvent(this, &event);
}